

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::DrawIndirect(DeviceContextVkImpl *this,DrawIndirectAttribs *Attribs)

{
  Uint32 *pUVar1;
  IBuffer *pIVar2;
  BufferVkImpl *this_00;
  BufferVkImpl *this_01;
  VkBuffer Buffer;
  size_t sVar3;
  VkBuffer CountBuffer;
  VkDeviceSize Offset;
  Uint32 Stride;
  
  this_01 = (BufferVkImpl *)0x0;
  DeviceContextBase<Diligent::EngineVkImplTraits>::DrawIndirect
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  this_00 = PrepareIndirectAttribsBuffer
                      (this,Attribs->pAttribsBuffer,Attribs->AttribsBufferStateTransitionMode,
                       "Indirect draw (DeviceContextVkImpl::DrawIndirect)");
  if (Attribs->pCounterBuffer != (IBuffer *)0x0) {
    this_01 = PrepareIndirectAttribsBuffer
                        (this,Attribs->pCounterBuffer,Attribs->CounterBufferStateTransitionMode,
                         "Count buffer (DeviceContextVkImpl::DrawIndirect)");
  }
  PrepareForDraw(this,Attribs->Flags);
  if (Attribs->DrawCount != 0) {
    pIVar2 = Attribs->pCounterBuffer;
    Buffer = BufferVkImpl::GetVkBuffer(this_00);
    sVar3 = GetDynamicBufferOffset(this,this_00,true);
    Offset = sVar3 + Attribs->DrawArgsOffset;
    if (pIVar2 == (IBuffer *)0x0) {
      Stride = 0;
      if (1 < Attribs->DrawCount) {
        Stride = Attribs->DrawArgsStride;
      }
      VulkanUtilities::VulkanCommandBuffer::DrawIndirect
                (&this->m_CommandBuffer,Buffer,Offset,Attribs->DrawCount,Stride);
    }
    else {
      CountBuffer = BufferVkImpl::GetVkBuffer(this_01);
      sVar3 = GetDynamicBufferOffset(this,this_01,true);
      VulkanUtilities::VulkanCommandBuffer::DrawIndirectCount
                (&this->m_CommandBuffer,Buffer,Offset,CountBuffer,sVar3 + Attribs->CounterOffset,
                 Attribs->DrawCount,Attribs->DrawArgsStride);
    }
  }
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::DrawIndirect(const DrawIndirectAttribs& Attribs)
{
    TDeviceContextBase::DrawIndirect(Attribs, 0);

    // We must prepare indirect draw attribs buffer first because state transitions must
    // be performed outside of render pass, and PrepareForDraw commits render pass
    BufferVkImpl* pIndirectDrawAttribsVk = PrepareIndirectAttribsBuffer(Attribs.pAttribsBuffer, Attribs.AttribsBufferStateTransitionMode, "Indirect draw (DeviceContextVkImpl::DrawIndirect)");
    BufferVkImpl* pCountBufferVk         = Attribs.pCounterBuffer != nullptr ?
        PrepareIndirectAttribsBuffer(Attribs.pCounterBuffer, Attribs.CounterBufferStateTransitionMode, "Count buffer (DeviceContextVkImpl::DrawIndirect)") :
        nullptr;

    PrepareForDraw(Attribs.Flags);

    if (Attribs.DrawCount > 0)
    {
        if (Attribs.pCounterBuffer == nullptr)
        {
            m_CommandBuffer.DrawIndirect(pIndirectDrawAttribsVk->GetVkBuffer(),
                                         GetDynamicBufferOffset(pIndirectDrawAttribsVk) + Attribs.DrawArgsOffset,
                                         Attribs.DrawCount, Attribs.DrawCount > 1 ? Attribs.DrawArgsStride : 0);
        }
        else
        {
            m_CommandBuffer.DrawIndirectCount(pIndirectDrawAttribsVk->GetVkBuffer(),
                                              GetDynamicBufferOffset(pIndirectDrawAttribsVk) + Attribs.DrawArgsOffset,
                                              pCountBufferVk->GetVkBuffer(),
                                              GetDynamicBufferOffset(pCountBufferVk) + Attribs.CounterOffset,
                                              Attribs.DrawCount,
                                              Attribs.DrawArgsStride);
        }
    }

    ++m_State.NumCommands;
}